

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

void array__erase(VoidArray *self,size_t element_size,uint32_t index)

{
  if (index < self->size) {
    memmove((void *)(index * element_size + (long)self->contents),
            (void *)((index + 1) * element_size + (long)self->contents),
            (self->size + ~index) * element_size);
    self->size = self->size - 1;
    return;
  }
  __assert_fail("index < self->size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/array.h"
                ,0x4f,"void array__erase(VoidArray *, size_t, uint32_t)");
}

Assistant:

static inline void array__erase(VoidArray *self, size_t element_size,
                                uint32_t index) {
  assert(index < self->size);
  char *contents = (char *)self->contents;
  memmove(contents + index * element_size, contents + (index + 1) * element_size,
          (self->size - index - 1) * element_size);
  self->size--;
}